

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int server_handle_finished(ptls_t *tls,ptls_iovec_t message)

{
  ptls_key_schedule_t *ppVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ptls_key_exchange_context_t *ppVar6;
  undefined8 uVar7;
  int iVar8;
  size_t sVar9;
  ptls_hash_context_t **pppVar10;
  
  iVar8 = verify_finished(tls,message);
  if (iVar8 == 0) {
    uVar2 = *(undefined8 *)&tls->field_20;
    uVar3 = *(undefined8 *)((long)&tls->field_20 + 8);
    uVar4 = *(undefined8 *)((long)&tls->field_20 + 0x10);
    uVar5 = *(undefined8 *)((long)&tls->field_20 + 0x18);
    ppVar6 = (tls->field_20).client.key_share_ctx;
    uVar7 = *(undefined8 *)((long)&tls->field_20 + 0x28);
    sVar9 = (tls->field_20).client.certificate_request.context.len;
    *(uint8_t **)((tls->traffic_protection).dec.secret + 0x30) =
         (tls->field_20).client.certificate_request.context.base;
    *(size_t *)((tls->traffic_protection).dec.secret + 0x38) = sVar9;
    *(ptls_key_exchange_context_t **)((tls->traffic_protection).dec.secret + 0x20) = ppVar6;
    *(undefined8 *)((tls->traffic_protection).dec.secret + 0x28) = uVar7;
    *(undefined8 *)((tls->traffic_protection).dec.secret + 0x10) = uVar4;
    *(undefined8 *)((tls->traffic_protection).dec.secret + 0x18) = uVar5;
    *(undefined8 *)(tls->traffic_protection).dec.secret = uVar2;
    *(undefined8 *)((tls->traffic_protection).dec.secret + 8) = uVar3;
    (*ptls_clear_memory)(&tls->field_20,0x40);
    iVar8 = setup_traffic_protection(tls,0,(char *)0x0,3,0);
    if (iVar8 == 0) {
      ppVar1 = tls->key_schedule;
      if (ppVar1->num_hashes != 0) {
        pppVar10 = &ppVar1->hashes[0].ctx;
        sVar9 = 0;
        do {
          (*(*pppVar10)->update)(*pppVar10,message.base,message.len);
          sVar9 = sVar9 + 1;
          pppVar10 = pppVar10 + 2;
        } while (sVar9 != ppVar1->num_hashes);
      }
      tls->state = PTLS_STATE_SERVER_POST_HANDSHAKE;
      iVar8 = 0;
    }
  }
  return iVar8;
}

Assistant:

static int server_handle_finished(ptls_t *tls, ptls_iovec_t message)
{
    int ret;

    if ((ret = verify_finished(tls, message)) != 0)
        return ret;

    memcpy(tls->traffic_protection.dec.secret, tls->server.pending_traffic_secret, sizeof(tls->server.pending_traffic_secret));
    ptls_clear_memory(tls->server.pending_traffic_secret, sizeof(tls->server.pending_traffic_secret));
    if ((ret = setup_traffic_protection(tls, 0, NULL, 3, 0)) != 0)
        return ret;

    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);

    tls->state = PTLS_STATE_SERVER_POST_HANDSHAKE;
    return 0;
}